

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 262intf.c
# Opt level: O1

UINT8 device_start_ymf262_nuked(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint clock;
  DEV_DATA chip;
  UINT8 UVar1;
  UINT32 rate;
  
  clock = cfg->clock;
  if ((cfg->srMode == '\x01') ||
     ((rate = clock / 0x120, cfg->srMode == '\x02' && (clock / 0x120 < cfg->smplRate)))) {
    rate = cfg->smplRate;
  }
  chip.chipInf = nukedopl3_init(clock,rate);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    UVar1 = 0xff;
  }
  else {
    nukedopl3_set_volume(chip.chipInf,0x10000);
    UVar1 = '\0';
    nukedopl3_set_mute_mask(chip.chipInf,0);
    *(void **)chip.chipInf = chip.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
    retDevInf->sampleRate = rate;
    retDevInf->devDef = &devDef262_Nuked;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_ymf262_nuked(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 288;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = nukedopl3_init(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	nukedopl3_set_volume(chip, 0x10000);
	nukedopl3_set_mute_mask(chip, 0x000000);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef262_Nuked);
	return 0x00;
}